

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

opj_bool dwt_decode_real(opj_tcd_tilecomp_t *tilec,int numres)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool bVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  v4 *__ptr;
  undefined4 *puVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  float *pfVar20;
  float *pfVar21;
  int x;
  size_t __size;
  opj_tcd_resolution_t *poVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  v4dwt_t h;
  v4dwt_t v;
  uint local_fc;
  uint local_f8;
  v4dwt_t local_c8;
  long local_b0;
  long local_a8;
  long local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  long local_78;
  float *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  float *local_50;
  v4dwt_t local_48;
  
  poVar22 = tilec->resolutions;
  iVar18 = poVar22->x1;
  iVar2 = poVar22->y1;
  iVar9 = numres + -1;
  if (iVar9 == 0) {
    __size = 0x50;
  }
  else {
    piVar13 = &poVar22[1].y1;
    uVar17 = 0;
    do {
      uVar16 = piVar13[-1] - ((opj_tcd_resolution_t *)(piVar13 + -3))->x0;
      if (uVar16 < uVar17) {
        uVar16 = uVar17;
      }
      uVar17 = *piVar13 - piVar13[-2];
      if ((uint)(*piVar13 - piVar13[-2]) < uVar16) {
        uVar17 = uVar16;
      }
      piVar13 = piVar13 + 0x26;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    __size = (ulong)(uVar17 + 5) << 4;
  }
  iVar9 = tilec->x1;
  iVar3 = tilec->x0;
  iVar4 = poVar22->x0;
  iVar5 = poVar22->y0;
  __ptr = (v4 *)malloc(__size);
  iVar19 = numres + -1;
  local_c8.wavelet = __ptr;
  local_48.wavelet = __ptr;
  if (iVar19 != 0) {
    x = iVar9 - iVar3;
    pfVar6 = (float *)tilec->data;
    iVar10 = (tilec->y1 - tilec->y0) * x;
    local_60 = (long)(x * 4);
    local_80 = pfVar6 + (((long)iVar9 + -1) - (long)iVar3);
    local_68 = local_60 * 4;
    local_88 = pfVar6 + (long)(x * 2) + -1;
    local_a8 = (long)(x * 2) << 2;
    local_90 = pfVar6 + (long)(x * 3) + -1;
    local_98 = pfVar6 + -1;
    local_a0 = (long)__ptr + -4;
    local_78 = (long)x << 2;
    local_b0 = (long)__ptr + -8;
    local_fc = iVar2 - iVar5;
    local_f8 = iVar18 - iVar4;
    do {
      local_c8.sn = local_f8;
      local_48.sn = local_fc;
      uVar17 = poVar22[1].x1 - poVar22[1].x0;
      uVar16 = poVar22[1].y1 - poVar22[1].y0;
      local_c8.dn = uVar17 - local_f8;
      local_c8.cas = poVar22[1].x0 % 2;
      pfVar21 = pfVar6;
      iVar18 = iVar10;
      if (3 < (int)uVar16) {
        lVar14 = (long)(int)uVar17;
        pfVar23 = local_80 + lVar14;
        pfVar20 = local_88 + lVar14;
        pfVar25 = local_90 + lVar14;
        pfVar24 = local_98 + lVar14;
        local_70 = (float *)(lVar14 * 0x10 + local_a0);
        uVar11 = uVar16;
        do {
          local_58 = (ulong)uVar11;
          local_50 = pfVar21;
          v4dwt_interleave_h(&local_c8,pfVar21,x,iVar18);
          v4dwt_decode(&local_c8);
          if (0 < (int)uVar17) {
            lVar15 = 0;
            pfVar21 = local_70;
            do {
              pfVar24[lVar15] = pfVar21[-3];
              pfVar23[lVar15] = pfVar21[-2];
              pfVar20[lVar15] = pfVar21[-1];
              pfVar25[lVar15] = *pfVar21;
              lVar1 = lVar14 + lVar15;
              lVar15 = lVar15 + -1;
              pfVar21 = pfVar21 + -4;
            } while (1 < lVar1);
          }
          pfVar21 = local_50 + local_60;
          iVar18 = iVar18 - (int)local_60;
          uVar11 = (int)local_58 - 4;
          pfVar23 = (float *)((long)pfVar23 + local_68);
          pfVar20 = (float *)((long)pfVar20 + local_68);
          pfVar25 = (float *)((long)pfVar25 + local_68);
          pfVar24 = (float *)((long)pfVar24 + local_68);
        } while (7 < (int)local_58);
      }
      lVar14 = local_78;
      uVar11 = uVar16 & 3;
      if (uVar11 != 0) {
        v4dwt_interleave_h(&local_c8,pfVar21,x,iVar18);
        v4dwt_decode(&local_c8);
        if (0 < (int)uVar17) {
          lVar15 = (ulong)uVar17 + 1;
          puVar12 = (undefined4 *)((ulong)uVar17 * 0x10 + local_b0);
          do {
            if (uVar11 != 1) {
              if (uVar11 != 2) {
                *(undefined4 *)((long)pfVar21 + lVar15 * 4 + local_a8 + -8) = *puVar12;
              }
              *(undefined4 *)((long)pfVar21 + lVar15 * 4 + lVar14 + -8) = puVar12[-1];
            }
            pfVar21[lVar15 + -2] = (float)puVar12[-2];
            lVar15 = lVar15 + -1;
            puVar12 = puVar12 + -4;
          } while (1 < lVar15);
        }
      }
      local_48.dn = uVar16 - local_fc;
      local_48.cas = poVar22[1].y0 % 2;
      pfVar21 = pfVar6;
      if (3 < (int)uVar17) {
        uVar11 = uVar17;
        do {
          v4dwt_interleave_v(&local_48,pfVar21,x,4);
          v4dwt_decode(&local_48);
          if (0 < (int)uVar16) {
            lVar15 = 0;
            pfVar23 = pfVar21;
            do {
              uVar8 = ((undefined8 *)((long)__ptr + lVar15))[1];
              *(undefined8 *)pfVar23 = *(undefined8 *)((long)__ptr + lVar15);
              *(undefined8 *)(pfVar23 + 2) = uVar8;
              pfVar23 = (float *)((long)pfVar23 + lVar14);
              lVar15 = lVar15 + 0x10;
            } while ((ulong)uVar16 << 4 != lVar15);
          }
          pfVar21 = pfVar21 + 4;
          bVar7 = 7 < (int)uVar11;
          uVar11 = uVar11 - 4;
        } while (bVar7);
      }
      uVar11 = uVar17 & 3;
      if (uVar11 != 0) {
        v4dwt_interleave_v(&local_48,pfVar21,x,uVar11);
        v4dwt_decode(&local_48);
        if (0 < (int)uVar16) {
          lVar15 = 0;
          do {
            memcpy(pfVar21,(void *)((long)__ptr + lVar15),(ulong)(uVar11 << 2));
            pfVar21 = (float *)((long)pfVar21 + lVar14);
            lVar15 = lVar15 + 0x10;
          } while ((ulong)uVar16 << 4 != lVar15);
        }
      }
      poVar22 = poVar22 + 1;
      iVar19 = iVar19 + -1;
      local_fc = uVar16;
      local_f8 = uVar17;
    } while (iVar19 != 0);
  }
  free(__ptr);
  return 1;
}

Assistant:

opj_bool dwt_decode_real(opj_tcd_tilecomp_t* restrict tilec, int numres){
	v4dwt_t h;
	v4dwt_t v;

	opj_tcd_resolution_t* res = tilec->resolutions;

	int rw = res->x1 - res->x0;	/* width of the resolution level computed */
	int rh = res->y1 - res->y0;	/* height of the resolution level computed */

	int w = tilec->x1 - tilec->x0;

	h.wavelet = (v4*) opj_aligned_malloc((dwt_max_resolution(res, numres)+5) * sizeof(v4));
	v.wavelet = h.wavelet;

	while( --numres) {
		float * restrict aj = (float*) tilec->data;
		int bufsize = (tilec->x1 - tilec->x0) * (tilec->y1 - tilec->y0);
		int j;

		h.sn = rw;
		v.sn = rh;

		++res;

		rw = res->x1 - res->x0;	/* width of the resolution level computed */
		rh = res->y1 - res->y0;	/* height of the resolution level computed */

		h.dn = rw - h.sn;
		h.cas = res->x0 % 2;

		for(j = rh; j > 3; j -= 4){
			int k;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					aj[k    ] = h.wavelet[k].f[0];
					aj[k+w  ] = h.wavelet[k].f[1];
					aj[k+w*2] = h.wavelet[k].f[2];
					aj[k+w*3] = h.wavelet[k].f[3];
				}
			aj += w*4;
			bufsize -= w*4;
		}
		if (rh & 0x03) {
				int k;
			j = rh & 0x03;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					switch(j) {
						case 3: aj[k+w*2] = h.wavelet[k].f[2];
						case 2: aj[k+w  ] = h.wavelet[k].f[1];
						case 1: aj[k    ] = h.wavelet[k].f[0];
					}
				}
			}

		v.dn = rh - v.sn;
		v.cas = res->y0 % 2;

		aj = (float*) tilec->data;
		for(j = rw; j > 3; j -= 4){
			int k;
			v4dwt_interleave_v(&v, aj, w, 4);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], 4 * sizeof(float));
				}
			aj += 4;
		}
		if (rw & 0x03){
				int k;
			j = rw & 0x03;
			v4dwt_interleave_v(&v, aj, w, j);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], j * sizeof(float));
				}
			}
	}

	opj_aligned_free(h.wavelet);
	return OPJ_TRUE;
}